

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReconv.c
# Opt level: O3

int Abc_NodeBuildCutLevelOne_int
              (Vec_Ptr_t *vVisited,Vec_Ptr_t *vLeaves,int nSizeLimit,int nFaninLimit)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  long lVar5;
  void **ppvVar6;
  int *piVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  long *plVar12;
  long *plVar13;
  
  uVar1 = vLeaves->nSize;
  if (0 < (long)(int)uVar1) {
    uVar8 = 100;
    lVar10 = 0;
    plVar12 = (long *)0x0;
    do {
      plVar13 = (long *)vLeaves->pArray[lVar10];
      uVar2 = *(uint *)((long)plVar13 + 0x14);
      if ((uVar2 & 0x20) == 0) {
        __assert_fail("pNode->fMarkB == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcReconv.c"
                      ,0x82,"int Abc_NodeGetLeafCostOne(Abc_Obj_t *, int)");
      }
      uVar11 = 999;
      if (((((uVar2 & 0xf) != 2) && ((uVar2 & 0xf) != 5)) &&
          (lVar9 = *(long *)(*(long *)(*plVar13 + 0x20) + 8),
          uVar11 = (uint)((*(byte *)(*(long *)(lVar9 + (long)((int *)plVar13[4])[1] * 8) + 0x14) &
                          0x20) == 0) +
                   (uint)((*(byte *)(*(long *)(lVar9 + (long)*(int *)plVar13[4] * 8) + 0x14) & 0x20)
                         == 0), 1 < uVar11)) &&
         (uVar11 = 2, nFaninLimit < *(int *)((long)plVar13 + 0x2c))) {
        uVar11 = 999;
      }
      if (((uVar11 < uVar8) ||
          ((uVar8 == uVar11 && (*(uint *)((long)plVar12 + 0x14) >> 0xc < uVar2 >> 0xc)))) &&
         (plVar12 = plVar13, uVar8 = uVar11, uVar11 == 0)) {
        uVar8 = 0;
        goto LAB_0029af70;
      }
      plVar13 = plVar12;
      lVar10 = lVar10 + 1;
      plVar12 = plVar13;
    } while ((int)uVar1 != lVar10);
    if (plVar13 != (long *)0x0) {
      if (2 < uVar8) {
        __assert_fail("CostBest < 3",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcReconv.c"
                      ,0x159,"int Abc_NodeBuildCutLevelOne_int(Vec_Ptr_t *, Vec_Ptr_t *, int, int)")
        ;
      }
LAB_0029af70:
      if ((int)(uVar8 + uVar1 + -1) <= nSizeLimit) {
        if ((*(uint *)((long)plVar13 + 0x14) & 0xf) != 7) {
          __assert_fail("Abc_ObjIsNode(pFaninBest)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcReconv.c"
                        ,0x15e,
                        "int Abc_NodeBuildCutLevelOne_int(Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
        }
        lVar10 = (ulong)uVar1 + 1;
        do {
          if ((int)lVar10 + -1 < 1) {
            __assert_fail("i >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x2f6,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
          }
          lVar9 = lVar10 + -1;
          lVar5 = lVar10 + -2;
          lVar10 = lVar9;
        } while ((long *)vLeaves->pArray[lVar5] != plVar13);
        for (; (int)lVar9 < (int)uVar1; lVar9 = lVar9 + 1) {
          vLeaves->pArray[lVar9 + -1] = vLeaves->pArray[lVar9];
        }
        vLeaves->nSize = uVar1 - 1;
        piVar7 = (int *)plVar13[4];
        lVar10 = *(long *)(*(long *)(*plVar13 + 0x20) + 8);
        pvVar4 = *(void **)(lVar10 + (long)*piVar7 * 8);
        if ((*(uint *)((long)pvVar4 + 0x14) & 0x20) == 0) {
          *(uint *)((long)pvVar4 + 0x14) = *(uint *)((long)pvVar4 + 0x14) | 0x20;
          uVar1 = vLeaves->nSize;
          if (uVar1 == vLeaves->nCap) {
            if ((int)uVar1 < 0x10) {
              if (vLeaves->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc(0x80);
              }
              else {
                ppvVar6 = (void **)realloc(vLeaves->pArray,0x80);
              }
              vLeaves->pArray = ppvVar6;
              vLeaves->nCap = 0x10;
            }
            else {
              if (vLeaves->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar6 = (void **)realloc(vLeaves->pArray,(ulong)uVar1 << 4);
              }
              vLeaves->pArray = ppvVar6;
              vLeaves->nCap = uVar1 * 2;
            }
          }
          else {
            ppvVar6 = vLeaves->pArray;
          }
          iVar3 = vLeaves->nSize;
          vLeaves->nSize = iVar3 + 1;
          ppvVar6[iVar3] = pvVar4;
          uVar1 = vVisited->nSize;
          if (uVar1 == vVisited->nCap) {
            if ((int)uVar1 < 0x10) {
              if (vVisited->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc(0x80);
              }
              else {
                ppvVar6 = (void **)realloc(vVisited->pArray,0x80);
              }
              vVisited->pArray = ppvVar6;
              vVisited->nCap = 0x10;
            }
            else {
              if (vVisited->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar6 = (void **)realloc(vVisited->pArray,(ulong)uVar1 << 4);
              }
              vVisited->pArray = ppvVar6;
              vVisited->nCap = uVar1 * 2;
            }
          }
          else {
            ppvVar6 = vVisited->pArray;
          }
          iVar3 = vVisited->nSize;
          vVisited->nSize = iVar3 + 1;
          ppvVar6[iVar3] = pvVar4;
          piVar7 = (int *)plVar13[4];
          lVar10 = *(long *)(*(long *)(*plVar13 + 0x20) + 8);
        }
        pvVar4 = *(void **)(lVar10 + (long)piVar7[1] * 8);
        if ((*(uint *)((long)pvVar4 + 0x14) & 0x20) == 0) {
          *(uint *)((long)pvVar4 + 0x14) = *(uint *)((long)pvVar4 + 0x14) | 0x20;
          uVar1 = vLeaves->nSize;
          if (uVar1 == vLeaves->nCap) {
            if ((int)uVar1 < 0x10) {
              if (vLeaves->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc(0x80);
              }
              else {
                ppvVar6 = (void **)realloc(vLeaves->pArray,0x80);
              }
              vLeaves->pArray = ppvVar6;
              vLeaves->nCap = 0x10;
            }
            else {
              if (vLeaves->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar6 = (void **)realloc(vLeaves->pArray,(ulong)uVar1 << 4);
              }
              vLeaves->pArray = ppvVar6;
              vLeaves->nCap = uVar1 * 2;
            }
          }
          else {
            ppvVar6 = vLeaves->pArray;
          }
          iVar3 = vLeaves->nSize;
          vLeaves->nSize = iVar3 + 1;
          ppvVar6[iVar3] = pvVar4;
          uVar1 = vVisited->nSize;
          if (uVar1 == vVisited->nCap) {
            if ((int)uVar1 < 0x10) {
              if (vVisited->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc(0x80);
              }
              else {
                ppvVar6 = (void **)realloc(vVisited->pArray,0x80);
              }
              vVisited->pArray = ppvVar6;
              vVisited->nCap = 0x10;
            }
            else {
              if (vVisited->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar6 = (void **)realloc(vVisited->pArray,(ulong)uVar1 << 4);
              }
              vVisited->pArray = ppvVar6;
              vVisited->nCap = uVar1 * 2;
            }
          }
          else {
            ppvVar6 = vVisited->pArray;
          }
          iVar3 = vVisited->nSize;
          vVisited->nSize = iVar3 + 1;
          ppvVar6[iVar3] = pvVar4;
        }
        if (vLeaves->nSize <= nSizeLimit) {
          return 1;
        }
        __assert_fail("vLeaves->nSize <= nSizeLimit",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcReconv.c"
                      ,0x175,"int Abc_NodeBuildCutLevelOne_int(Vec_Ptr_t *, Vec_Ptr_t *, int, int)")
        ;
      }
    }
  }
  return 0;
}

Assistant:

int Abc_NodeBuildCutLevelOne_int( Vec_Ptr_t * vVisited, Vec_Ptr_t * vLeaves, int nSizeLimit, int nFaninLimit )
{
    Abc_Obj_t * pNode, * pFaninBest, * pNext;
    int CostBest, CostCur, i;
    // find the best fanin
    CostBest   = 100;
    pFaninBest = NULL;
//printf( "Evaluating fanins of the cut:\n" );
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pNode, i )
    {
        CostCur = Abc_NodeGetLeafCostOne( pNode, nFaninLimit );
//printf( "    Fanin %s has cost %d.\n", Abc_ObjName(pNode), CostCur );
//        if ( CostBest > CostCur ) // performance improvement: expand the variable with the smallest level
        if ( CostBest > CostCur ||
             (CostBest == CostCur && pNode->Level > pFaninBest->Level) )
        {
            CostBest   = CostCur;
            pFaninBest = pNode;
        }
        if ( CostBest == 0 )
            break;
    }
    if ( pFaninBest == NULL )
        return 0;
//        return Abc_NodeBuildCutLevelTwo_int( vVisited, vLeaves, nFaninLimit );

    assert( CostBest < 3 );
    if ( vLeaves->nSize - 1 + CostBest > nSizeLimit )
        return 0;
//        return Abc_NodeBuildCutLevelTwo_int( vVisited, vLeaves, nFaninLimit );

    assert( Abc_ObjIsNode(pFaninBest) );
    // remove the node from the array
    Vec_PtrRemove( vLeaves, pFaninBest );
//printf( "Removing fanin %s.\n", Abc_ObjName(pFaninBest) );

    // add the left child to the fanins
    pNext = Abc_ObjFanin0(pFaninBest);
    if ( !pNext->fMarkB )
    {
//printf( "Adding fanin %s.\n", Abc_ObjName(pNext) );
        pNext->fMarkB = 1;
        Vec_PtrPush( vLeaves, pNext );
        Vec_PtrPush( vVisited, pNext );
    }
    // add the right child to the fanins
    pNext = Abc_ObjFanin1(pFaninBest);
    if ( !pNext->fMarkB )
    {
//printf( "Adding fanin %s.\n", Abc_ObjName(pNext) );
        pNext->fMarkB = 1;
        Vec_PtrPush( vLeaves, pNext );
        Vec_PtrPush( vVisited, pNext );
    }
    assert( vLeaves->nSize <= nSizeLimit );
    // keep doing this
    return 1;
}